

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

RelationsMap * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getRelated
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *start,Relations *relations,
          bool toFirstStrict)

{
  bool bVar1;
  iterator relations_00;
  _WordT *in_RCX;
  RelationsMap *in_RDI;
  byte in_R8B;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> *pair;
  iterator __end3;
  iterator __begin3;
  RelationsMap *__range3;
  RelationsMap result;
  Relations augmented;
  bool in_stack_00000197;
  Relations *in_stack_00000198;
  Bucket *in_stack_000001a0;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_000001a8;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffff58;
  RelationsMap *this_00;
  reference in_stack_ffffffffffffff78;
  _Self local_78;
  undefined1 *local_70;
  undefined1 local_68 [48];
  bitset<12UL> local_38;
  undefined8 local_30;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_38.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)*in_RCX;
  this_00 = in_RDI;
  local_30 = dg::vr::Relations::getAugmented((Relations)local_38.super__Base_bitset<1UL>._M_w);
  getAugmentedRelated(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000197);
  local_70 = local_68;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin(in_stack_ffffffffffffff58);
  relations_00 = std::
                 map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                 ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::operator!=(&local_78,(_Self *)&stack0xffffffffffffff80);
    if (!bVar1) break;
    in_stack_ffffffffffffff78 =
         std::
         _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
         ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                      *)0x1dfb2c);
    dg::vr::Relations::addImplied();
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)this_00);
  }
  filterResult((Relations *)relations_00._M_node,(RelationsMap *)in_stack_ffffffffffffff78);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::map(this_00,in_stack_ffffffffffffff58);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x1dfb74);
  return in_RDI;
}

Assistant:

RelationsMap getRelated(const Bucket &start, const Relations &relations,
                            bool toFirstStrict = false) const {
        Relations augmented = Relations::getAugmented(relations);

        RelationsMap result =
                getAugmentedRelated(start, augmented, toFirstStrict);

        for (auto &pair : result) {
            pair.second.addImplied();
        }

        return filterResult(relations, result);
    }